

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isAllowedInCompilationUnit(SyntaxKind kind)

{
  bool bVar1;
  
  if ((((((1 < kind - ExternModuleDecl) && (kind != BindDirective)) && (kind != ConfigDeclaration))
       && ((kind != InterfaceDeclaration && (kind != ModuleDeclaration)))) &&
      ((kind != PackageDeclaration &&
       ((kind != ProgramDeclaration && (kind != TimeUnitsDeclaration)))))) &&
     (kind != UdpDeclaration)) {
    bVar1 = isAllowedInPackage(kind);
    return bVar1;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isAllowedInCompilationUnit(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ProgramDeclaration:
        case SyntaxKind::PackageDeclaration:
        case SyntaxKind::BindDirective:
        case SyntaxKind::UdpDeclaration:
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::ExternUdpDecl:
        case SyntaxKind::ConfigDeclaration:
            return true;
        default:
            return isAllowedInPackage(kind);
    }
}